

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Proxy.hpp
# Opt level: O2

pod_type arma::op_norm::
         vec_norm_min<arma::eGlue<arma::Col<double>,arma::Col<double>,arma::eglue_minus>>
                   (Proxy<arma::eGlue<arma::Col<double>,_arma::Col<double>,_arma::eglue_minus>_> *P)

{
  uint uVar1;
  eGlue<arma::Col<double>,_arma::Col<double>,_arma::eglue_minus> *peVar2;
  Col<double> *pCVar3;
  double *pdVar4;
  double *pdVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  
  peVar2 = P->Q;
  pCVar3 = (peVar2->P1).Q;
  uVar1 = (pCVar3->super_Mat<double>).n_elem;
  if ((ulong)uVar1 == 1) {
    dVar7 = ABS(*(pCVar3->super_Mat<double>).mem - *(((peVar2->P2).Q)->super_Mat<double>).mem);
  }
  else {
    dVar7 = INFINITY;
  }
  for (lVar6 = 0; lVar6 + 1U < (ulong)uVar1; lVar6 = lVar6 + 2) {
    pdVar4 = (pCVar3->super_Mat<double>).mem;
    pdVar5 = (((peVar2->P2).Q)->super_Mat<double>).mem;
    dVar8 = ABS(pdVar4[lVar6] - pdVar5[lVar6]);
    if (dVar7 <= dVar8) {
      dVar8 = dVar7;
    }
    dVar7 = ABS(pdVar4[lVar6 + 1] - pdVar5[lVar6 + 1]);
    if (dVar8 <= dVar7) {
      dVar7 = dVar8;
    }
  }
  dVar8 = dVar7;
  if (((uint)lVar6 < uVar1) &&
     (dVar8 = ABS((pCVar3->super_Mat<double>).mem[lVar6] -
                  (((peVar2->P2).Q)->super_Mat<double>).mem[lVar6]), dVar7 <= dVar8)) {
    dVar8 = dVar7;
  }
  return dVar8;
}

Assistant:

arma_inline uword get_n_elem() const { return Q.get_n_elem();              }